

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O0

Prefix * __thiscall
duckdb::Prefix::TransformToDeprecatedAppend
          (Prefix *this,ART *art,unsafe_unique_ptr<FixedSizeAllocator> *allocator,uint8_t byte)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  IndexPointer IVar2;
  ART *in_RCX;
  Prefix *in_RDX;
  unsafe_unique_ptr<FixedSizeAllocator> *in_RSI;
  Prefix *in_RDI;
  undefined1 in_R8B;
  Prefix prefix;
  undefined7 in_stack_00000048;
  undefined7 in_stack_ffffffffffffff98;
  uint8_t in_stack_ffffffffffffff9f;
  Prefix *pPVar3;
  IndexPointer in_stack_ffffffffffffffc0;
  uint8_t byte_00;
  undefined7 in_stack_ffffffffffffffe0;
  
  pPVar3 = in_RDI;
  if (*(char *)((long)&((in_RSI->
                        super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                        )._M_t.
                        super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                        .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl)->
                       buffer_manager + 7) == '\x0f') {
    unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>::
    operator->((unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>
                *)in_RDI);
    IVar2 = FixedSizeAllocator::New((FixedSizeAllocator *)CONCAT17(byte,in_stack_00000048));
    byte_00 = (uint8_t)(IVar2.data >> 0x38);
    Node::operator=((Node *)in_RDI,
                    (IndexPointer *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    IndexPointer::SetMetadata((IndexPointer *)in_RDI,in_stack_ffffffffffffff9f);
    Prefix((Prefix *)
           (in_RSI[1].
            super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
            .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl)->block_manager
           ,in_RSI,(Node)in_stack_ffffffffffffffc0.data,(idx_t)pPVar3);
    TransformToDeprecatedAppend
              (in_RDX,in_RCX,
               (unsafe_unique_ptr<FixedSizeAllocator> *)CONCAT17(in_R8B,in_stack_ffffffffffffffe0),
               byte_00);
  }
  else {
    *(undefined1 *)
     ((long)&((in_RSI->
              super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
              .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl)->
             block_manager +
     (ulong)*(byte *)((long)&((in_RSI->
                              super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                              )._M_t.
                              super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                              .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>.
                             _M_head_impl)->buffer_manager + 7)) = in_R8B;
    _Var1._M_head_impl =
         (in_RSI->
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    *(char *)((long)&(_Var1._M_head_impl)->buffer_manager + 7) =
         *(char *)((long)&(_Var1._M_head_impl)->buffer_manager + 7) + '\x01';
    in_RDI->data = (data_ptr_t)
                   (in_RSI->
                   super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                   )._M_t.
                   super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                   .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    in_RDI->ptr = (Node *)in_RSI[1].
                          super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                          .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    *(FixedSizeAllocator **)&in_RDI->in_memory =
         in_RSI[2].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  }
  return pPVar3;
}

Assistant:

Prefix Prefix::TransformToDeprecatedAppend(ART &art, unsafe_unique_ptr<FixedSizeAllocator> &allocator, uint8_t byte) {
	if (data[DEPRECATED_COUNT] != DEPRECATED_COUNT) {
		data[data[DEPRECATED_COUNT]] = byte;
		data[DEPRECATED_COUNT]++;
		return *this;
	}

	*ptr = allocator->New();
	ptr->SetMetadata(static_cast<uint8_t>(PREFIX));
	Prefix prefix(allocator, *ptr, DEPRECATED_COUNT);
	return prefix.TransformToDeprecatedAppend(art, allocator, byte);
}